

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O3

void __thiscall fat::get_cluster_content(fat *this,int32_t cluster)

{
  pointer pbVar1;
  int32_t cluster_00;
  fat *pfVar2;
  fat *this_00;
  char *this_01;
  char cStack_61;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_48;
  fat *pfStack_30;
  fat *pfStack_28;
  
  pfVar2 = (fat *)(long)cluster;
  if (this->fat_table[(long)pfVar2] != this->FAT_FILE_END) {
    do {
      pbVar1 = (this->cluster_data).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((fat *)((long)(this->cluster_data).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= pfVar2)
      goto LAB_0010753d;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pbVar1[(long)pfVar2]._M_dataplus._M_p,
                 pbVar1[(long)pfVar2]._M_string_length);
      pfVar2 = (fat *)(long)this->fat_table[(long)pfVar2];
    } while (this->fat_table[(long)pfVar2] != this->FAT_FILE_END);
  }
  pbVar1 = (this->cluster_data).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pfVar2 < (fat *)((long)(this->cluster_data).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pbVar1[(long)pfVar2]._M_dataplus._M_p,
               pbVar1[(long)pfVar2]._M_string_length);
    return;
  }
LAB_0010753d:
  this_01 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  this_00 = pfVar2;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  cStack_61 = '/';
  pfStack_30 = pfVar2;
  pfStack_28 = this;
  explode(&vStack_48,this_00,(string *)this_00,&cStack_61);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_60,&vStack_48);
  cluster_00 = get_file_start((fat *)this_01,&vStack_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_60);
  if (cluster_00 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PATH NOT FOUND",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
  }
  else {
    get_cluster_content((fat *)this_01,cluster_00);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_48);
  return;
}

Assistant:

void fat::get_cluster_content(int32_t cluster) {
    //pokud je prazdny (tedy zacina 0, tak nevypisuj obsah)
    if (fat_table[cluster] == FAT_FILE_END) {
        std::cout << cluster_data.at(cluster);
    } else {
        std::cout << cluster_data.at(cluster);
        get_cluster_content(fat_table[cluster]);
    }
}